

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O0

DdNode * cuddBddIsop(DdManager *dd,DdNode *L,DdNode *U)

{
  int iVar1;
  int iVar2;
  DdManager *T;
  DdManager *E;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *pDVar6;
  DdNode *n_00;
  int local_100;
  int local_fc;
  int index;
  DdNode *r;
  DdNode *Unv;
  DdNode *Lnv;
  DdNode *Uv;
  DdNode *Lv;
  DdNode *sum;
  DdNode *term1;
  DdNode *term0;
  DdNode *x;
  DdNode *Id;
  DdNode *Isub1;
  DdNode *Isub0;
  DdNode *Usuper1;
  DdNode *Lsuper1;
  DdNode *Usuper0;
  DdNode *Lsuper0;
  DdNode *Ud;
  DdNode *Ld;
  DdNode *Usub1;
  DdNode *Lsub1;
  DdNode *Usub0;
  DdNode *Lsub0;
  int top_u;
  int top_l;
  int v;
  DdNode *zero;
  DdNode *one;
  DdNode *U_local;
  DdNode *L_local;
  DdManager *dd_local;
  
  T = (DdManager *)dd->one;
  E = (DdManager *)((ulong)T ^ 1);
  dd_local = E;
  if ((((DdManager *)L != E) && (dd_local = T, (DdManager *)U != T)) &&
     (dd_local = (DdManager *)cuddCacheLookup2(dd,cuddBddIsop,L,U), dd_local == (DdManager *)0x0)) {
    iVar1 = dd->perm[*(uint *)((ulong)L & 0xfffffffffffffffe)];
    iVar2 = dd->perm[*(uint *)((ulong)U & 0xfffffffffffffffe)];
    local_100 = iVar1;
    if (iVar2 < iVar1) {
      local_100 = iVar2;
    }
    if (iVar1 == local_100) {
      local_fc = *(int *)((ulong)L & 0xfffffffffffffffe);
      Uv = *(DdNode **)(((ulong)L & 0xfffffffffffffffe) + 0x10);
      Unv = *(DdNode **)(((ulong)L & 0xfffffffffffffffe) + 0x18);
      if (((ulong)L & 1) != 0) {
        Uv = (DdNode *)((ulong)Uv ^ 1);
        Unv = (DdNode *)((ulong)Unv ^ 1);
      }
    }
    else {
      local_fc = *(int *)((ulong)U & 0xfffffffffffffffe);
      Unv = L;
      Uv = L;
    }
    r = U;
    Lnv = U;
    if (iVar2 == local_100) {
      Lnv = *(DdNode **)(((ulong)U & 0xfffffffffffffffe) + 0x10);
      r = *(DdNode **)(((ulong)U & 0xfffffffffffffffe) + 0x18);
      if (((ulong)U & 1) != 0) {
        Lnv = (DdNode *)((ulong)Lnv ^ 1);
        r = (DdNode *)((ulong)r ^ 1);
      }
    }
    pDVar3 = cuddBddAndRecur(dd,Unv,(DdNode *)((ulong)Lnv ^ 1));
    if (pDVar3 == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      Cudd_Ref(pDVar3);
      pDVar4 = cuddBddAndRecur(dd,Uv,(DdNode *)((ulong)r ^ 1));
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar3);
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(pDVar4);
        pDVar5 = cuddBddIsop(dd,pDVar3,r);
        if (pDVar5 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_RecursiveDeref(dd,pDVar4);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(pDVar5);
          n = cuddBddIsop(dd,pDVar4,Lnv);
          if (n == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,pDVar4);
            Cudd_RecursiveDeref(dd,pDVar5);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(n);
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,pDVar4);
            pDVar3 = cuddBddAndRecur(dd,Unv,(DdNode *)((ulong)pDVar5 ^ 1));
            if (pDVar3 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,pDVar5);
              Cudd_RecursiveDeref(dd,n);
              dd_local = (DdManager *)0x0;
            }
            else {
              Cudd_Ref(pDVar3);
              pDVar4 = cuddBddAndRecur(dd,Uv,(DdNode *)((ulong)n ^ 1));
              if (pDVar4 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar5);
                Cudd_RecursiveDeref(dd,n);
                Cudd_RecursiveDeref(dd,pDVar3);
                dd_local = (DdManager *)0x0;
              }
              else {
                Cudd_Ref(pDVar4);
                pDVar6 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar3 ^ 1),
                                         (DdNode *)((ulong)pDVar4 ^ 1));
                pDVar6 = (DdNode *)((ulong)pDVar6 ^ (long)(int)(uint)(pDVar6 != (DdNode *)0x0));
                if (pDVar6 == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,pDVar5);
                  Cudd_RecursiveDeref(dd,n);
                  Cudd_RecursiveDeref(dd,pDVar3);
                  Cudd_RecursiveDeref(dd,pDVar4);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  Cudd_Ref(pDVar6);
                  n_00 = cuddBddAndRecur(dd,r,Lnv);
                  if (n_00 == (DdNode *)0x0) {
                    Cudd_RecursiveDeref(dd,pDVar5);
                    Cudd_RecursiveDeref(dd,n);
                    Cudd_RecursiveDeref(dd,pDVar3);
                    Cudd_RecursiveDeref(dd,pDVar4);
                    Cudd_RecursiveDeref(dd,pDVar6);
                    dd_local = (DdManager *)0x0;
                  }
                  else {
                    Cudd_Ref(n_00);
                    Cudd_RecursiveDeref(dd,pDVar3);
                    Cudd_RecursiveDeref(dd,pDVar4);
                    pDVar3 = cuddBddIsop(dd,pDVar6,n_00);
                    if (pDVar3 == (DdNode *)0x0) {
                      Cudd_RecursiveDeref(dd,pDVar5);
                      Cudd_RecursiveDeref(dd,n);
                      Cudd_RecursiveDeref(dd,pDVar6);
                      Cudd_RecursiveDeref(dd,n_00);
                      dd_local = (DdManager *)0x0;
                    }
                    else {
                      Cudd_Ref(pDVar3);
                      Cudd_RecursiveDeref(dd,pDVar6);
                      Cudd_RecursiveDeref(dd,n_00);
                      pDVar4 = cuddUniqueInter(dd,local_fc,(DdNode *)T,(DdNode *)E);
                      if (pDVar4 == (DdNode *)0x0) {
                        Cudd_RecursiveDeref(dd,pDVar5);
                        Cudd_RecursiveDeref(dd,n);
                        Cudd_RecursiveDeref(dd,pDVar3);
                        dd_local = (DdManager *)0x0;
                      }
                      else {
                        Cudd_Ref(pDVar4);
                        pDVar6 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar4 ^ 1),pDVar5);
                        if (pDVar6 == (DdNode *)0x0) {
                          Cudd_RecursiveDeref(dd,pDVar5);
                          Cudd_RecursiveDeref(dd,n);
                          Cudd_RecursiveDeref(dd,pDVar3);
                          Cudd_RecursiveDeref(dd,pDVar4);
                          dd_local = (DdManager *)0x0;
                        }
                        else {
                          Cudd_Ref(pDVar6);
                          Cudd_RecursiveDeref(dd,pDVar5);
                          pDVar5 = cuddBddAndRecur(dd,pDVar4,n);
                          if (pDVar5 == (DdNode *)0x0) {
                            Cudd_RecursiveDeref(dd,n);
                            Cudd_RecursiveDeref(dd,pDVar3);
                            Cudd_RecursiveDeref(dd,pDVar4);
                            Cudd_RecursiveDeref(dd,pDVar6);
                            dd_local = (DdManager *)0x0;
                          }
                          else {
                            Cudd_Ref(pDVar5);
                            Cudd_RecursiveDeref(dd,pDVar4);
                            Cudd_RecursiveDeref(dd,n);
                            pDVar4 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar6 ^ 1),
                                                     (DdNode *)((ulong)pDVar5 ^ 1));
                            pDVar4 = (DdNode *)
                                     ((ulong)pDVar4 ^ (long)(int)(uint)(pDVar4 != (DdNode *)0x0));
                            if (pDVar4 == (DdNode *)0x0) {
                              Cudd_RecursiveDeref(dd,pDVar3);
                              Cudd_RecursiveDeref(dd,pDVar6);
                              Cudd_RecursiveDeref(dd,pDVar5);
                              dd_local = (DdManager *)0x0;
                            }
                            else {
                              Cudd_Ref(pDVar4);
                              Cudd_RecursiveDeref(dd,pDVar6);
                              Cudd_RecursiveDeref(dd,pDVar5);
                              pDVar5 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar4 ^ 1),
                                                       (DdNode *)((ulong)pDVar3 ^ 1));
                              dd_local = (DdManager *)
                                         ((ulong)pDVar5 ^ (long)(int)(uint)(pDVar5 != (DdNode *)0x0)
                                         );
                              if (dd_local == (DdManager *)0x0) {
                                Cudd_RecursiveDeref(dd,pDVar3);
                                Cudd_RecursiveDeref(dd,pDVar4);
                                dd_local = (DdManager *)0x0;
                              }
                              else {
                                Cudd_Ref((DdNode *)dd_local);
                                Cudd_RecursiveDeref(dd,pDVar4);
                                Cudd_RecursiveDeref(dd,pDVar3);
                                cuddCacheInsert2(dd,cuddBddIsop,L,U,(DdNode *)dd_local);
                                Cudd_Deref((DdNode *)dd_local);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddBddIsop(
  DdManager * dd,
  DdNode * L,
  DdNode * U)
{
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = Cudd_Not(one);
    int         v, top_l, top_u;
    DdNode      *Lsub0, *Usub0, *Lsub1, *Usub1, *Ld, *Ud;
    DdNode      *Lsuper0, *Usuper0, *Lsuper1, *Usuper1;
    DdNode      *Isub0, *Isub1, *Id;
    DdNode      *x;
    DdNode      *term0, *term1, *sum;
    DdNode      *Lv, *Uv, *Lnv, *Unv;
    DdNode      *r;
    int         index;

    statLine(dd);
    if (L == zero)
        return(zero);
    if (U == one)
        return(one);

    /* Check cache */
    r = cuddCacheLookup2(dd, cuddBddIsop, L, U);
    if (r)
        return(r);

    top_l = dd->perm[Cudd_Regular(L)->index];
    top_u = dd->perm[Cudd_Regular(U)->index];
    v = ddMin(top_l, top_u);

    /* Compute cofactors */
    if (top_l == v) {
        index = Cudd_Regular(L)->index;
        Lv = Cudd_T(L);
        Lnv = Cudd_E(L);
        if (Cudd_IsComplement(L)) {
            Lv = Cudd_Not(Lv);
            Lnv = Cudd_Not(Lnv);
        }
    }
    else {
        index = Cudd_Regular(U)->index;
        Lv = Lnv = L;
    }

    if (top_u == v) {
        Uv = Cudd_T(U);
        Unv = Cudd_E(U);
        if (Cudd_IsComplement(U)) {
            Uv = Cudd_Not(Uv);
            Unv = Cudd_Not(Unv);
        }
    }
    else {
        Uv = Unv = U;
    }

    Lsub0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Uv));
    if (Lsub0 == NULL)
        return(NULL);
    Cudd_Ref(Lsub0);
    Usub0 = Unv;
    Lsub1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Unv));
    if (Lsub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        return(NULL);
    }
    Cudd_Ref(Lsub1);
    Usub1 = Uv;

    Isub0 = cuddBddIsop(dd, Lsub0, Usub0);
    if (Isub0 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        return(NULL);
    }
    Cudd_Ref(Isub0);
    Isub1 = cuddBddIsop(dd, Lsub1, Usub1);
    if (Isub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        Cudd_RecursiveDeref(dd, Isub0);
        return(NULL);
    }
    Cudd_Ref(Isub1);
    Cudd_RecursiveDeref(dd, Lsub0);
    Cudd_RecursiveDeref(dd, Lsub1);

    Lsuper0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Isub0));
    if (Lsuper0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        return(NULL);
    }
    Cudd_Ref(Lsuper0);
    Lsuper1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Isub1));
    if (Lsuper1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        return(NULL);
    }
    Cudd_Ref(Lsuper1);
    Usuper0 = Unv;
    Usuper1 = Uv;

    /* Ld = Lsuper0 + Lsuper1 */
    Ld = cuddBddAndRecur(dd, Cudd_Not(Lsuper0), Cudd_Not(Lsuper1));
    Ld = Cudd_NotCond(Ld, Ld != NULL);
    if (Ld == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        return(NULL);
    }
    Cudd_Ref(Ld);
    Ud = cuddBddAndRecur(dd, Usuper0, Usuper1);
    if (Ud == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        Cudd_RecursiveDeref(dd, Ld);
        return(NULL);
    }
    Cudd_Ref(Ud);
    Cudd_RecursiveDeref(dd, Lsuper0);
    Cudd_RecursiveDeref(dd, Lsuper1);

    Id = cuddBddIsop(dd, Ld, Ud);
    if (Id == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Ld);
        Cudd_RecursiveDeref(dd, Ud);
        return(NULL);
    }
    Cudd_Ref(Id);
    Cudd_RecursiveDeref(dd, Ld);
    Cudd_RecursiveDeref(dd, Ud);

    x = cuddUniqueInter(dd, index, one, zero);
    if (x == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        return(NULL);
    }
    Cudd_Ref(x);
    term0 = cuddBddAndRecur(dd, Cudd_Not(x), Isub0);
    if (term0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        return(NULL);
    }
    Cudd_Ref(term0);
    Cudd_RecursiveDeref(dd, Isub0);
    term1 = cuddBddAndRecur(dd, x, Isub1);
    if (term1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        Cudd_RecursiveDeref(dd, term0);
        return(NULL);
    }
    Cudd_Ref(term1);
    Cudd_RecursiveDeref(dd, x);
    Cudd_RecursiveDeref(dd, Isub1);
    /* sum = term0 + term1 */
    sum = cuddBddAndRecur(dd, Cudd_Not(term0), Cudd_Not(term1));
    sum = Cudd_NotCond(sum, sum != NULL);
    if (sum == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, term0);
        Cudd_RecursiveDeref(dd, term1);
        return(NULL);
    }
    Cudd_Ref(sum);
    Cudd_RecursiveDeref(dd, term0);
    Cudd_RecursiveDeref(dd, term1);
    /* r = sum + Id */
    r = cuddBddAndRecur(dd, Cudd_Not(sum), Cudd_Not(Id));
    r = Cudd_NotCond(r, r != NULL);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, sum);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDeref(dd, sum);
    Cudd_RecursiveDeref(dd, Id);

    cuddCacheInsert2(dd, cuddBddIsop, L, U, r);

    Cudd_Deref(r);
    return(r);

}